

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utColladaExportCamera.cpp
# Opt level: O2

void __thiscall
ColladaExportCamera_testExportCamera_Test::TestBody(ColladaExportCamera_testExportCamera_Test *this)

{
  long lVar1;
  uint uVar2;
  aiCamera *other;
  ulong uVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *pcVar5;
  char *in_R9;
  long lVar6;
  ulong uVar7;
  _Head_base<0UL,_aiString_*,_false> _Var8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  char *in_stack_ffffffffffffff38;
  AssertHelper in_stack_ffffffffffffff40;
  AssertionResult gtest_ar_;
  unique_ptr<float[],_std::default_delete<float[]>_> origFOV;
  AssertionResult gtest_ar;
  aiScene *imported;
  unique_ptr<float[],_std::default_delete<float[]>_> orifClipPlaneNear;
  long local_70;
  unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_> pos;
  AssertHelper local_60;
  uint origNumCams;
  unique_ptr<aiString[],_std::default_delete<aiString[]>_> names;
  unique_ptr<float[],_std::default_delete<float[]>_> orifClipPlaneFar;
  aiScene *pTest;
  long local_38;
  
  pTest = Assimp::Importer::ReadFile
                    ((this->super_ColladaExportCamera).im,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/Collada/cameras.dae"
                     ,0x400);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&gtest_ar,"nullptr","pTest",(void **)&gtest_ar_,&pTest);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&origFOV,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
               ,0x4d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&origFOV,(Message *)&gtest_ar_);
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&origFOV);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    bVar10 = pTest->mCameras != (aiCamera **)0x0;
    bVar11 = pTest->mNumCameras != 0;
    this_00 = &gtest_ar_.message_;
    gtest_ar_.success_ = bVar11 && bVar10;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar11 && bVar10) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(this_00);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      pcVar4 = (char *)0x0;
      origFOV._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl._0_4_ =
           Assimp::Exporter::Export
                     ((this->super_ColladaExportCamera).ex,pTest,"collada","cameraExp.dae",0,
                      (ExportProperties *)0x0);
      testing::internal::CmpHelperEQ<aiReturn,aiReturn>
                ((internal *)&gtest_ar,"aiReturn_SUCCESS","ex->Export(pTest,\"collada\",file)",
                 (aiReturn *)&gtest_ar_,(aiReturn *)&origFOV);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&origFOV,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                   ,0x51,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&origFOV,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&origFOV);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      uVar2 = pTest->mNumCameras;
      uVar7 = (ulong)uVar2;
      uVar3 = uVar7 * 4;
      origNumCams = uVar2;
      origFOV._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(uVar3);
      orifClipPlaneNear._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(uVar3);
      orifClipPlaneFar._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(uVar3);
      names._M_t.super___uniq_ptr_impl<aiString,_std::default_delete<aiString[]>_>._M_t.
      super__Tuple_impl<0UL,_aiString_*,_std::default_delete<aiString[]>_>.
      super__Head_base<0UL,_aiString_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiString,_std::default_delete<aiString[]>,_true,_true>)
           operator_new__(uVar7 * 0x404);
      if (uVar2 != 0) {
        _Var8._M_head_impl =
             (aiString *)
             names._M_t.super___uniq_ptr_impl<aiString,_std::default_delete<aiString[]>_>._M_t.
             super__Tuple_impl<0UL,_aiString_*,_std::default_delete<aiString[]>_>.
             super__Head_base<0UL,_aiString_*,_false>._M_head_impl;
        do {
          (_Var8._M_head_impl)->length = 0;
          *(undefined1 *)((long)_Var8._M_head_impl + 4) = 0;
          memset((void *)((long)_Var8._M_head_impl + 5),0x1b,0x3ff);
          _Var8._M_head_impl = _Var8._M_head_impl + 0x404;
        } while (_Var8._M_head_impl !=
                 (aiString *)
                 ((long)names._M_t.super___uniq_ptr_impl<aiString,_std::default_delete<aiString[]>_>
                        ._M_t.super__Tuple_impl<0UL,_aiString_*,_std::default_delete<aiString[]>_>.
                        super__Head_base<0UL,_aiString_*,_false>._M_head_impl + uVar7 * 0x404));
      }
      pos._M_t.super___uniq_ptr_impl<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>_>.
      _M_t.super__Tuple_impl<0UL,_aiVector3t<float>_*,_std::default_delete<aiVector3t<float>[]>_>.
      super__Head_base<0UL,_aiVector3t<float>_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>,_true,_true>
           )operator_new__(uVar7 * 0xc);
      if (uVar2 != 0) {
        uVar3 = uVar7 * 0xc - 0xc;
        memset((void *)pos._M_t.
                       super___uniq_ptr_impl<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aiVector3t<float>_*,_std::default_delete<aiVector3t<float>[]>_>
                       .super__Head_base<0UL,_aiVector3t<float>_*,_false>._M_head_impl,0,
               (uVar3 - uVar3 % 0xc) + 0xc);
      }
      lVar9 = 0;
      lVar6 = 0;
      uVar3 = 0;
      do {
        if (uVar7 <= uVar3) {
          imported = Assimp::Importer::ReadFile
                               ((this->super_ColladaExportCamera).im,"cameraExp.dae",0x400);
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
                    ((internal *)&gtest_ar,"nullptr","imported",(void **)&gtest_ar_,&imported);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,100,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
LAB_0037f4b7:
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            bVar10 = imported->mCameras != (aiCamera **)0x0;
            bVar11 = imported->mNumCameras != 0;
            gtest_ar_.success_ = bVar11 && bVar10;
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar11 || !bVar10) {
              testing::Message::Message((Message *)&stack0xffffffffffffff40);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,
                         (AssertionResult *)"imported->HasCameras()","false","true",pcVar4);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x66,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=
                        (&local_60,(Message *)&stack0xffffffffffffff40);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              std::__cxx11::string::~string((string *)&gtest_ar);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&stack0xffffffffffffff40);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&gtest_ar,"origNumCams","imported->mNumCameras",&origNumCams,
                       &imported->mNumCameras);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                         ,0x67,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff40);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            lVar6 = 0;
            local_70 = 0;
            for (uVar3 = 0; uVar3 < imported->mNumCameras; uVar3 = uVar3 + 1) {
              other = imported->mCameras[uVar3];
              local_38 = lVar6;
              bVar10 = aiString::operator==
                                 ((aiString *)
                                  ((long)names._M_t.
                                         super___uniq_ptr_impl<aiString,_std::default_delete<aiString[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_aiString_*,_std::default_delete<aiString[]>_>
                                         .super__Head_base<0UL,_aiString_*,_false>._M_head_impl +
                                  lVar6),&other->mName);
              gtest_ar_.success_ = bVar10;
              gtest_ar_.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!bVar10) {
                testing::Message::Message((Message *)&stack0xffffffffffffff40);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)"names[ i ] == read->mName","false","true",pcVar4);
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                           ,0x6c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=
                          (&local_60,(Message *)&stack0xffffffffffffff40);
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                std::__cxx11::string::~string((string *)&gtest_ar);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&stack0xffffffffffffff40);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar_.message_);
              testing::internal::DoubleNearPredFormat
                        ((char *)in_stack_ffffffffffffff40.data_,in_stack_ffffffffffffff38,
                         (char *)0x37f65c,(double)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                         (double)origFOV._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl,
                         (double)gtest_ar_.message_.ptr_);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar5 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                           ,0x6d,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"orifClipPlaneNear[ i ]","read->mClipPlaneNear",
                         *(float *)((long)orifClipPlaneNear._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   uVar3 * 4),other->mClipPlaneNear);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar5 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                           ,0x6e,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"orifClipPlaneFar[ i ]","read->mClipPlaneFar",
                         *(float *)((long)orifClipPlaneFar._M_t.
                                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                          .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                   uVar3 * 4),other->mClipPlaneFar);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar5 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                           ,0x6f,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"pos[ i ].x","read->mPosition.x",
                         *(float *)((long)pos._M_t.
                                          super___uniq_ptr_impl<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_aiVector3t<float>_*,_std::default_delete<aiVector3t<float>[]>_>
                                          .super__Head_base<0UL,_aiVector3t<float>_*,_false>.
                                          _M_head_impl + local_70),(other->mPosition).x);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar5 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                           ,0x71,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"pos[ i ].y","read->mPosition.y",
                         *(float *)((long)pos._M_t.
                                          super___uniq_ptr_impl<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_aiVector3t<float>_*,_std::default_delete<aiVector3t<float>[]>_>
                                          .super__Head_base<0UL,_aiVector3t<float>_*,_false>.
                                          _M_head_impl + 4 + local_70),(other->mPosition).y);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar5 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                           ,0x72,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"pos[ i ].z","read->mPosition.z",
                         *(float *)((long)pos._M_t.
                                          super___uniq_ptr_impl<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_aiVector3t<float>_*,_std::default_delete<aiVector3t<float>[]>_>
                                          .super__Head_base<0UL,_aiVector3t<float>_*,_false>.
                                          _M_head_impl + 8 + local_70),(other->mPosition).z);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar5 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                           ,0x73,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xffffffffffffff40);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              local_70 = local_70 + 0xc;
              lVar6 = local_38 + 0x404;
            }
          }
          std::unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>::
          ~unique_ptr(&pos);
          std::unique_ptr<aiString[],_std::default_delete<aiString[]>_>::~unique_ptr(&names);
          std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&orifClipPlaneFar);
          std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&orifClipPlaneNear);
          std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&origFOV);
          return;
        }
        gtest_ar_._0_8_ = pTest->mCameras[uVar3];
        imported = (aiScene *)0x0;
        testing::internal::CmpHelperNE<decltype(nullptr),aiCamera_const*>
                  ((internal *)&gtest_ar,"nullptr","orig",&imported,(aiCamera **)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&imported);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                     ,0x5a,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&imported);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&imported);
          goto LAB_0037f4b7;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        *(undefined4 *)
         ((long)origFOV._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar3 * 4) =
             *(undefined4 *)(gtest_ar_._0_8_ + 0x428);
        *(undefined4 *)
         ((long)orifClipPlaneNear._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar3 * 4) =
             *(undefined4 *)(gtest_ar_._0_8_ + 0x42c);
        *(undefined4 *)
         ((long)orifClipPlaneFar._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar3 * 4) =
             *(undefined4 *)(gtest_ar_._0_8_ + 0x430);
        lVar1 = (long)names._M_t.super___uniq_ptr_impl<aiString,_std::default_delete<aiString[]>_>.
                      _M_t.super__Tuple_impl<0UL,_aiString_*,_std::default_delete<aiString[]>_>.
                      super__Head_base<0UL,_aiString_*,_false>._M_head_impl + lVar9;
        if (lVar1 != gtest_ar_._0_8_) {
          uVar2 = *(uint *)gtest_ar_._0_8_;
          *(uint *)((long)names._M_t.
                          super___uniq_ptr_impl<aiString,_std::default_delete<aiString[]>_>._M_t.
                          super__Tuple_impl<0UL,_aiString_*,_std::default_delete<aiString[]>_>.
                          super__Head_base<0UL,_aiString_*,_false>._M_head_impl + lVar9) = uVar2;
          memcpy((uint *)((long)names._M_t.
                                super___uniq_ptr_impl<aiString,_std::default_delete<aiString[]>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_aiString_*,_std::default_delete<aiString[]>_>
                                .super__Head_base<0UL,_aiString_*,_false>._M_head_impl + lVar9) + 1,
                 (void *)(gtest_ar_._0_8_ + 4),(ulong)uVar2);
          *(undefined1 *)((ulong)uVar2 + 4 + lVar1) = 0;
        }
        *(undefined4 *)
         ((long)pos._M_t.
                super___uniq_ptr_impl<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>_>.
                _M_t.
                super__Tuple_impl<0UL,_aiVector3t<float>_*,_std::default_delete<aiVector3t<float>[]>_>
                .super__Head_base<0UL,_aiVector3t<float>_*,_false>._M_head_impl + 8 + lVar6) =
             *(undefined4 *)(gtest_ar_._0_8_ + 0x40c);
        *(undefined8 *)
         ((long)pos._M_t.
                super___uniq_ptr_impl<aiVector3t<float>,_std::default_delete<aiVector3t<float>[]>_>.
                _M_t.
                super__Tuple_impl<0UL,_aiVector3t<float>_*,_std::default_delete<aiVector3t<float>[]>_>
                .super__Head_base<0UL,_aiVector3t<float>_*,_false>._M_head_impl + lVar6) =
             *(undefined8 *)(gtest_ar_._0_8_ + 0x404);
        uVar3 = uVar3 + 1;
        uVar7 = (ulong)origNumCams;
        lVar6 = lVar6 + 0xc;
        lVar9 = lVar9 + 0x404;
      } while( true );
    }
    testing::Message::Message((Message *)&origFOV);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"pTest->HasCameras()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&orifClipPlaneNear,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
               ,0x4e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&orifClipPlaneNear,(Message *)&origFOV);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&orifClipPlaneNear);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&origFOV);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  return;
}

Assistant:

TEST_F(ColladaExportCamera, testExportCamera) {
    const char* file = "cameraExp.dae";

    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/Collada/cameras.dae", aiProcess_ValidateDataStructure);
    ASSERT_NE( nullptr, pTest );
    ASSERT_TRUE(pTest->HasCameras());


    EXPECT_EQ( AI_SUCCESS, ex->Export(pTest,"collada",file));
    const unsigned int origNumCams( pTest->mNumCameras );
    std::unique_ptr<float[]> origFOV( new float[ origNumCams ] );
    std::unique_ptr<float[]> orifClipPlaneNear( new float[ origNumCams ] );
    std::unique_ptr<float[]> orifClipPlaneFar( new float[ origNumCams ] );
    std::unique_ptr<aiString[]> names( new aiString[ origNumCams ] );
    std::unique_ptr<aiVector3D[]> pos( new aiVector3D[ origNumCams ] );
    for (size_t i = 0; i < origNumCams; i++) {
        const aiCamera *orig = pTest->mCameras[ i ];
        ASSERT_NE(nullptr, orig );

        origFOV[ i ] = orig->mHorizontalFOV;
        orifClipPlaneNear[ i ] = orig->mClipPlaneNear;
        orifClipPlaneFar[ i ] = orig->mClipPlaneFar;
        names[ i ] = orig->mName;
        pos[ i ] = orig->mPosition;
    }
    const aiScene* imported = im->ReadFile(file, aiProcess_ValidateDataStructure);

    ASSERT_NE(nullptr, imported );

    EXPECT_TRUE( imported->HasCameras() );
    EXPECT_EQ( origNumCams, imported->mNumCameras );

    for(size_t i=0; i< imported->mNumCameras;i++){
        const aiCamera *read = imported->mCameras[ i ];

        EXPECT_TRUE( names[ i ] == read->mName );
        EXPECT_NEAR( origFOV[ i ],read->mHorizontalFOV, 0.0001f );
        EXPECT_FLOAT_EQ( orifClipPlaneNear[ i ], read->mClipPlaneNear);
        EXPECT_FLOAT_EQ( orifClipPlaneFar[ i ], read->mClipPlaneFar);

        EXPECT_FLOAT_EQ( pos[ i ].x,read->mPosition.x);
        EXPECT_FLOAT_EQ( pos[ i ].y,read->mPosition.y);
        EXPECT_FLOAT_EQ( pos[ i ].z,read->mPosition.z);
    }
}